

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_flattening.cpp
# Opt level: O0

void __thiscall
ModelFlattening_flatteningImportedUnitsThatNeedEquivalence_Test::TestBody
          (ModelFlattening_flatteningImportedUnitsThatNeedEquivalence_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  element_type *peVar4;
  element_type *peVar5;
  AssertHelper local_1e0 [8];
  Message local_1d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_1;
  PrinterPtr printer;
  ModelPtr flatModel;
  AssertHelper local_160 [8];
  Message local_158 [15];
  bool local_149;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_;
  string local_130 [32];
  string local_110 [32];
  AssertHelper local_f0 [8];
  Message local_e8 [8];
  unsigned_long local_e0 [2];
  undefined1 local_d0 [8];
  AssertionResult gtest_ar;
  string local_b8 [32];
  string local_98 [32];
  undefined1 local_78 [8];
  ModelPtr model;
  ImporterPtr importer;
  ParserPtr parser;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string e;
  ModelFlattening_flatteningImportedUnitsThatNeedEquivalence_Test *this_local;
  
  e.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"test_model\">\n  <units name=\"per_fmol\">\n    <unit exponent=\"-1\" units=\"fmol\"/>\n  </units>\n  <units name=\"fmol\">\n    <unit prefix=\"femto\" units=\"mole\"/>\n  </units>\n  <units name=\"per_fmol_sec4\">\n    <unit units=\"per_fmol\"/>\n    <unit exponent=\"4\" units=\"per_sec\"/>\n  </units>\n  <units name=\"per_sec\">\n    <unit exponent=\"-1\" units=\"second\"/>\n  </units>\n</model>\n"
             ,&local_31);
  std::allocator<char>::~allocator(&local_31);
  this_00 = &importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  libcellml::Parser::create(SUB81(this_00,0));
  libcellml::Importer::create((bool)((char)&model + '\b'));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b8,"generator/cellml_slc_example/slc_model_units_only.cellml",
             (allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  fileContents(local_98);
  libcellml::Parser::parseModel((string *)local_78);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  local_e0[1] = 0;
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  local_e0[0] = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_d0,"size_t(0)","parser->issueCount()",local_e0 + 1,local_e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(local_e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              (local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x764,pcVar3);
    testing::internal::AssertHelper::operator=(local_f0,local_e8);
    testing::internal::AssertHelper::~AssertHelper(local_f0);
    testing::Message::~Message(local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  peVar4 = std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_130,"generator/cellml_slc_example",
             (allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  resourcePath(local_110);
  libcellml::Importer::resolveImports((shared_ptr *)peVar4,(string *)local_78);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_78);
  bVar2 = libcellml::Model::hasUnresolvedImports();
  local_149 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_148,&local_149,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(local_158);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)
               &flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,local_148,"model->hasUnresolvedImports()","true");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x767,pcVar3);
    testing::internal::AssertHelper::operator=(local_160,local_158);
    testing::internal::AssertHelper::~AssertHelper(local_160);
    std::__cxx11::string::~string
              ((string *)
               &flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    testing::Message::~Message(local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Importer::flattenModel
            ((shared_ptr *)
             &printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  libcellml::Printer::create();
  peVar5 = std::__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar_1.message_);
  libcellml::Printer::printModel_abi_cxx11_((shared_ptr *)&local_1d0,SUB81(peVar5,0));
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_1b0,"e","printer->printModel(flatModel)",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             &local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(local_1d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              (local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x76c,pcVar3);
    testing::internal::AssertHelper::operator=(local_1e0,local_1d8);
    testing::internal::AssertHelper::~AssertHelper(local_1e0);
    testing::Message::~Message(local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  std::shared_ptr<libcellml::Printer>::~shared_ptr
            ((shared_ptr<libcellml::Printer> *)&gtest_ar_1.message_);
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_78);
  std::shared_ptr<libcellml::Importer>::~shared_ptr
            ((shared_ptr<libcellml::Importer> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(ModelFlattening, flatteningImportedUnitsThatNeedEquivalence)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"test_model\">\n"
        "  <units name=\"per_fmol\">\n"
        "    <unit exponent=\"-1\" units=\"fmol\"/>\n"
        "  </units>\n"
        "  <units name=\"fmol\">\n"
        "    <unit prefix=\"femto\" units=\"mole\"/>\n"
        "  </units>\n"
        "  <units name=\"per_fmol_sec4\">\n"
        "    <unit units=\"per_fmol\"/>\n"
        "    <unit exponent=\"4\" units=\"per_sec\"/>\n"
        "  </units>\n"
        "  <units name=\"per_sec\">\n"
        "    <unit exponent=\"-1\" units=\"second\"/>\n"
        "  </units>\n"
        "</model>\n";

    auto parser = libcellml::Parser::create();
    auto importer = libcellml::Importer::create();

    auto model = parser->parseModel(fileContents("generator/cellml_slc_example/slc_model_units_only.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    importer->resolveImports(model, resourcePath("generator/cellml_slc_example"));
    EXPECT_FALSE(model->hasUnresolvedImports());

    auto flatModel = importer->flattenModel(model);

    auto printer = libcellml::Printer::create();
    EXPECT_EQ(e, printer->printModel(flatModel));
}